

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O1

void __thiscall
CGraphics_Threaded::QuadsSetSubsetFree
          (CGraphics_Threaded *this,float x0,float y0,float x1,float y1,float x2,float y2,float x3,
          float y3,int TextureIndex)

{
  int iVar1;
  float fVar2;
  
  iVar1 = (*this->m_pBackend->_vptr_IGraphicsBackend[5])();
  if ((-1 < TextureIndex) && (1 < iVar1)) {
    TilesetFallbackSystem(this,TextureIndex);
  }
  (this->m_State).m_TextureArrayIndex = this->m_TextureArrayIndex;
  this->m_aTexture[0].u = x0;
  this->m_aTexture[0].v = y0;
  this->m_aTexture[1].u = x1;
  this->m_aTexture[1].v = y1;
  this->m_aTexture[2].u = x2;
  this->m_aTexture[2].v = y2;
  this->m_aTexture[3].u = x3;
  this->m_aTexture[3].v = y3;
  iVar1 = (*this->m_pBackend->_vptr_IGraphicsBackend[5])();
  fVar2 = ((float)TextureIndex + 0.5) / (256.0 / (float)iVar1);
  this->m_aTexture[3].i = fVar2;
  this->m_aTexture[2].i = fVar2;
  this->m_aTexture[1].i = fVar2;
  this->m_aTexture[0].i = fVar2;
  (this->m_State).m_Dimension = (uint)TextureIndex >> 0x1f ^ 3;
  return;
}

Assistant:

void CGraphics_Threaded::QuadsSetSubsetFree(
	float x0, float y0, float x1, float y1,
	float x2, float y2, float x3, float y3, int TextureIndex)
{
	// tileset fallback system
	if(m_pBackend->GetTextureArraySize() > 1 && TextureIndex >= 0)
		TilesetFallbackSystem(TextureIndex);

	m_State.m_TextureArrayIndex = m_TextureArrayIndex;

	m_aTexture[0].u = x0; m_aTexture[0].v = y0;
	m_aTexture[1].u = x1; m_aTexture[1].v = y1;
	m_aTexture[2].u = x2; m_aTexture[2].v = y2;
	m_aTexture[3].u = x3; m_aTexture[3].v = y3;

	m_aTexture[0].i = m_aTexture[1].i = m_aTexture[2].i = m_aTexture[3].i = (0.5f + TextureIndex) / (256.0f/m_pBackend->GetTextureArraySize());
	m_State.m_Dimension = (TextureIndex < 0) ? 2 : 3;
}